

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

int Gia_ManFindAnnotatedDelay(Gia_Man_t *p,int DelayC,int *pnBoxes,int fIgnoreBoxDelays)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  Gia_Obj_t *pObj_00;
  bool bVar5;
  int local_6c;
  int local_64;
  int Id;
  int nBoxes;
  int DelayMax;
  int Delay1;
  int Delay0;
  int Delay;
  int iBoxOutId;
  int iBox;
  int k;
  int i;
  int *pDelays;
  Gia_Obj_t *pGStack_30;
  int nRealPis;
  Gia_Obj_t *pObj;
  int fIgnoreBoxDelays_local;
  int *pnBoxes_local;
  int DelayC_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManBoxNum(p);
  if (iVar1 == 0) {
    local_6c = Gia_ManCiNum(p);
  }
  else {
    local_6c = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
  }
  piVar4 = Vec_IntArray(p->vLevels);
  Id = 0;
  local_64 = 0;
  p_00 = p->vLevels;
  iVar1 = Gia_ManObjNum(p);
  Vec_IntFill(p_00,iVar1,0);
  iBox = 1;
  while( true ) {
    bVar5 = false;
    if (iBox < p->nObjs) {
      pGStack_30 = Gia_ManObj(p,iBox);
      bVar5 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsCi(pGStack_30);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pGStack_30);
      if (iVar1 == 0) {
        if (((*(ulong *)pGStack_30 >> 0x1e & 1) != 0) && ((*(ulong *)pGStack_30 >> 0x3e & 1) != 0))
        {
          __assert_fail("!pObj->fMark0 || !pObj->fMark1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                        ,0x43a,"int Gia_ManFindAnnotatedDelay(Gia_Man_t *, int, int *, int)");
        }
        iVar1 = Gia_ObjFaninId0(pGStack_30,iBox);
        iVar1 = piVar4[iVar1];
        iVar3 = Gia_ObjFaninId1(pGStack_30,iBox);
        iVar3 = piVar4[iVar3];
        if ((*(ulong *)pGStack_30 >> 0x1e & 1) == 0) {
          if ((*(ulong *)pGStack_30 >> 0x3e & 1) == 0) {
            Delay1 = Abc_MaxInt(iVar1 + 100,iVar3 + 100);
          }
          else {
            Delay1 = Abc_MaxInt(iVar3 + DelayC,iVar1 + 100);
            local_64 = local_64 + 1;
          }
        }
        else {
          Delay1 = Abc_MaxInt(iVar1 + DelayC,iVar3 + 100);
          local_64 = local_64 + 1;
        }
        piVar4[iBox] = Delay1;
      }
      else {
        iVar1 = Gia_ObjFaninId0(pGStack_30,iBox);
        piVar4[iBox] = piVar4[iVar1];
        Id = Abc_MaxInt(Id,piVar4[iBox]);
      }
    }
    else if (fIgnoreBoxDelays == 0) {
      iVar1 = Gia_ObjCioId(pGStack_30);
      uVar2 = iVar1 - local_6c;
      if (-1 < (int)uVar2) {
        iVar1 = Gia_ManBoxNum(p);
        if (iVar1 <= (int)uVar2 / 2) {
          __assert_fail("iBox < Gia_ManBoxNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                        ,0x423,"int Gia_ManFindAnnotatedDelay(Gia_Man_t *, int, int *, int)");
        }
        Delay1 = 0;
        for (iBoxOutId = 0; iBoxOutId < 3; iBoxOutId = iBoxOutId + 1) {
          pObj_00 = Gia_ManCo(p,((int)uVar2 / 2) * 3 + iBoxOutId);
          iVar1 = Gia_ObjId(p,pObj_00);
          if (iBox <= iVar1) {
            __assert_fail("Id < i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                          ,0x429,"int Gia_ManFindAnnotatedDelay(Gia_Man_t *, int, int *, int)");
          }
          Delay1 = Abc_MaxInt(Delay1,piVar4[iVar1]);
        }
        if ((uVar2 & 1) == 0) {
          Delay1 = Delay1 + 100;
        }
        else {
          Delay1 = DelayC + Delay1;
        }
        piVar4[iBox] = Delay1;
      }
    }
    iBox = iBox + 1;
  }
  if (pnBoxes != (int *)0x0) {
    *pnBoxes = local_64;
  }
  return Id;
}

Assistant:

int Gia_ManFindAnnotatedDelay( Gia_Man_t * p, int DelayC, int * pnBoxes, int fIgnoreBoxDelays )
{
    Gia_Obj_t * pObj;
    int nRealPis = Gia_ManBoxNum(p) ? Tim_ManPiNum((Tim_Man_t *)p->pManTime) : Gia_ManCiNum(p);
    int * pDelays = Vec_IntArray(p->vLevels);
    int i, k, iBox, iBoxOutId, Delay, Delay0, Delay1, DelayMax = 0, nBoxes = 0;
    Vec_IntFill( p->vLevels, Gia_ManObjNum(p), 0 );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            if ( fIgnoreBoxDelays )
                continue;
            // check if it is real PI
            iBoxOutId = Gia_ObjCioId(pObj) - nRealPis;
            if ( iBoxOutId < 0 )
                continue;
            // if it is a box output, find box number
            iBox = iBoxOutId / 2;
            assert( iBox < Gia_ManBoxNum(p) );
            // check find the maximum delay of the box inputs
            Delay = 0;
            for ( k = 0; k < 3; k++ )
            {
                int Id = Gia_ObjId( p, Gia_ManCo(p, iBox*3+k) );
                assert( Id < i );
                Delay = Abc_MaxInt( Delay, pDelays[Id] );
            }
            // consider outputs
            if ( iBoxOutId & 1 ) // carry output
                Delay += DelayC;
            else // sum output
                Delay += 100;
            pDelays[i] = Delay;
            continue;
        }
        if ( Gia_ObjIsCo(pObj) )
        {
            pDelays[i] = pDelays[Gia_ObjFaninId0(pObj, i)];
            DelayMax = Abc_MaxInt( DelayMax, pDelays[i] );
            continue;
        }
        assert( !pObj->fMark0 || !pObj->fMark1 );
        Delay0 = pDelays[Gia_ObjFaninId0(pObj, i)];
        Delay1 = pDelays[Gia_ObjFaninId1(pObj, i)];
        if ( pObj->fMark0 )
        {
            Delay = Abc_MaxInt( Delay0 + DelayC, Delay1 + 100 );
            nBoxes++;
        }
        else if ( pObj->fMark1 )
        {
            Delay = Abc_MaxInt( Delay1 + DelayC, Delay0 + 100 );
            nBoxes++;
        }
        else
            Delay = Abc_MaxInt( Delay0 + 100, Delay1 + 100 );
        pDelays[i] = Delay;
    }
    if ( pnBoxes )
        *pnBoxes = nBoxes;
    return DelayMax;
}